

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void memory_region_init_io_ppc
               (uc_struct_conflict10 *uc,MemoryRegion *mr,MemoryRegionOps *ops,void *opaque,
               uint64_t size)

{
  memory_region_init_ppc(uc,mr,size);
  if (ops == (MemoryRegionOps *)0x0) {
    ops = &unassigned_mem_ops_ppc;
  }
  mr->ops = ops;
  mr->opaque = opaque;
  mr->terminates = true;
  return;
}

Assistant:

void memory_region_init_io(struct uc_struct *uc,
                           MemoryRegion *mr,
                           const MemoryRegionOps *ops,
                           void *opaque,
                           uint64_t size)
{
    memory_region_init(uc, mr, size);
    mr->ops = ops ? ops : &unassigned_mem_ops;
    mr->opaque = opaque;
    mr->terminates = true;
}